

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::DisassembledInstruction>::destruct
          (BasicTypeInfo<dap::DisassembledInstruction> *this,void *ptr)

{
  DisassembledInstruction::~DisassembledInstruction((DisassembledInstruction *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }